

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall despot::Parser::ParseHasTerminalTag(Parser *this,TiXmlHandle *xml_handle)

{
  bool bVar1;
  int iVar2;
  char *__s;
  log_ostream *plVar3;
  ostream *this_00;
  void *this_01;
  allocator<char> local_71;
  string local_70;
  string local_50;
  TiXmlHandle local_30;
  TiXmlHandle local_28;
  TiXmlElement *local_20;
  TiXmlElement *e_HasTerminal;
  TiXmlHandle *xml_handle_local;
  Parser *this_local;
  
  e_HasTerminal = (TiXmlElement *)xml_handle;
  xml_handle_local = (TiXmlHandle *)this;
  util::tinyxml::TiXmlHandle::FirstChild(&local_30,(char *)xml_handle);
  util::tinyxml::TiXmlHandle::FirstChild(&local_28,(char *)&local_30);
  local_20 = util::tinyxml::TiXmlHandle::ToElement(&local_28);
  if (local_20 == (TiXmlElement *)0x0) {
    this->has_terminal_ = true;
  }
  else {
    __s = util::tinyxml::TiXmlElement::GetText(local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,__s,&local_71);
    lower(&local_50,&local_70);
    bVar1 = std::operator==(&local_50,"true");
    this->has_terminal_ = bVar1;
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  iVar2 = logging::level();
  if ((0 < iVar2) && (iVar2 = logging::level(), 2 < iVar2)) {
    plVar3 = logging::stream(3);
    this_00 = std::operator<<(&plVar3->super_ostream,"HasTerminal = ");
    this_01 = (void *)std::ostream::operator<<(this_00,(bool)(this->has_terminal_ & 1));
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Parser::ParseHasTerminalTag(TiXmlHandle& xml_handle) {
	TiXmlElement* e_HasTerminal = xml_handle.FirstChild("pomdpx").FirstChild(
		"HasTerminal").ToElement();
	if (e_HasTerminal != NULL) {
		has_terminal_ = (lower(e_HasTerminal->GetText()) == "true");
	} else {
		has_terminal_ = true;
	}
	logi << "HasTerminal = " << has_terminal_ << endl;
}